

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Histogram.cpp
# Opt level: O0

shared_ptr<Image> __thiscall Histogram::toImage(Histogram *this,uint height_per_channel)

{
  uint uVar1;
  int iVar2;
  uint in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  uint *in_RSI;
  element_type *in_RDI;
  shared_ptr<Image> sVar4;
  int ty_1;
  int y_1;
  int ty;
  int y;
  int bar_height;
  Pixel pixel;
  uchar inverse;
  uchar color;
  int i;
  int scale;
  int c;
  Pixel black;
  shared_ptr<Image> *img;
  Pixel *in_stack_ffffffffffffff68;
  Image *in_stack_ffffffffffffff70;
  element_type *this_00;
  uint local_5c;
  int local_54;
  uchar local_4a [4];
  Pixel local_46;
  uchar local_42;
  uchar local_41;
  int local_40;
  uint local_2c;
  int local_28;
  undefined4 local_24;
  int local_20;
  uint local_1c;
  undefined1 local_15;
  uint local_14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  local_15 = 0;
  local_1c = in_RSI[1];
  local_20 = *in_RSI * in_EDX;
  this_00 = in_RDI;
  local_14 = in_EDX;
  sVar4 = std::make_shared<Image,unsigned_int,unsigned_int>(in_RSI,(uint *)in_RDI);
  _Var3 = sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_24 = 0xff000000;
  for (local_28 = 0; local_28 < (int)*in_RSI; local_28 = local_28 + 1) {
    local_2c = max((Histogram *)this_00,(int)((ulong)in_RDI >> 0x20));
    _Var3._M_pi = extraout_RDX;
    for (local_40 = 0; local_40 < (int)in_RSI[1]; local_40 = local_40 + 1) {
      local_41 = (char)(local_40 / 2) + 0x80;
      local_42 = 0x80 - (char)(local_40 / 2);
      local_46.colors[1] = local_42;
      local_46.colors[0] = local_42;
      local_46.colors[2] = local_42;
      local_46.colors[3] = 0xff;
      if (local_28 == 3) {
        local_46.colors[0] = 0xff;
        local_46.colors[1] = 0xff;
        local_46.colors[2] = 0xff;
        local_46.colors[3] = local_41;
      }
      local_46.colors[local_28] = local_41;
      uVar1 = local_14;
      iVar2 = count((Histogram *)in_stack_ffffffffffffff70,
                    (uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38),(int)in_stack_ffffffffffffff68
                   );
      local_5c = (uVar1 * iVar2) / local_2c;
      _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((ulong)(uVar1 * iVar2) % (ulong)local_2c);
      for (local_54 = 0; local_54 < (int)local_5c; local_54 = local_54 + 1) {
        std::__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11da7b)
        ;
        in_stack_ffffffffffffff70 =
             (Image *)Image::pixel(in_stack_ffffffffffffff70,
                                   (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                                   (int)in_stack_ffffffffffffff68);
        *(uchar (*) [4])&in_stack_ffffffffffffff70->pixels = local_46.colors;
        _Var3._M_pi = extraout_RDX_00;
      }
      for (; local_5c < local_14; local_5c = local_5c + 1) {
        std::__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11dae5)
        ;
        in_stack_ffffffffffffff68 =
             Image::pixel(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                          (int)in_stack_ffffffffffffff68);
        *(undefined4 *)in_stack_ffffffffffffff68->colors = local_24;
        _Var3._M_pi = extraout_RDX_01;
      }
    }
  }
  sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (shared_ptr<Image>)sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Image> Histogram::toImage(unsigned int height_per_channel) const {
  auto img = std::make_shared<Image>((unsigned int) range, channels * height_per_channel);

  // Create a black background color for the histogram
  Pixel black = {{0, 0, 0, 255}};

  // Loop over all channels
  for (int c = 0; c < channels; c++) {
    // Find the channel maximum value to scale down the bars
    int scale = max(c);
    // Loop over all intensities
    for (int i = 0; i < range; i++) {

      // Create a color for this bar based on intensity position
      auto color = (unsigned char) (128 + i / 2);
      auto inverse = (unsigned char) (128 - i / 2);

      Pixel pixel = {{inverse, inverse, inverse, 255}};

      // If this is the alpha channel, the color should be white and slowly fade out
      if (c == 3) {
        pixel = {{255, 255, 255, color}};
      }

      // Set the actual channel to the color based on intensity
      pixel.colors[c] = color;

      // Figure out the height of the histogram bar, but use dB
      auto bar_height = (int) ((height_per_channel * count((unsigned char) i, c)) / scale);

      // Draw the bar vertically
      for (int y = 0; y < bar_height; y++) {
        int ty = ((c + 1) * height_per_channel - 1) - y;
        img->pixel(i, ty) = pixel;
      }

      // Color the rest of the pixels black
      for (int y = bar_height; y < height_per_channel; y++) {
        int ty = ((c + 1) * height_per_channel - 1) - y;
        img->pixel(i, ty) = black;
      }
    }
  }

  return img;
}